

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericunixtheme.cpp
# Opt level: O1

QStringList * QGenericUnixTheme::iconFallbackPaths(void)

{
  char cVar1;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  QFileInfo pixmapsIconsDir;
  QString local_38;
  undefined1 *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0x0;
  (in_RDI->d).ptr = (QString *)0x0;
  (in_RDI->d).size = 0;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = L"/usr/share/pixmaps";
  local_38.d.size = 0x12;
  QFileInfo::QFileInfo((QFileInfo *)&local_20,&local_38);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  cVar1 = QFileInfo::isDir();
  if (cVar1 != '\0') {
    QFileInfo::absoluteFilePath();
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)in_RDI,(in_RDI->d).size,&local_38);
    QList<QString>::end(in_RDI);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QFileInfo::~QFileInfo((QFileInfo *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QGenericUnixTheme::iconFallbackPaths()
{
    QStringList paths;
    const QFileInfo pixmapsIconsDir(QStringLiteral("/usr/share/pixmaps"));
    if (pixmapsIconsDir.isDir())
        paths.append(pixmapsIconsDir.absoluteFilePath());

    return paths;
}